

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_vibrato(xm_context_t *ctx,xm_channel_context_t *ch,uint8_t param)

{
  byte in_DL;
  xm_context_t *in_RSI;
  undefined8 in_RDI;
  float fVar1;
  xm_waveform_type_t unaff_retaddr;
  undefined7 in_stack_ffffffffffffffe8;
  
  *(short *)((in_RSI->module).pattern_table + 0x5e) =
       *(short *)((in_RSI->module).pattern_table + 0x5e) + (short)((int)(uint)in_DL >> 4);
  fVar1 = xm_waveform(unaff_retaddr,(uint8_t)((ulong)in_RDI >> 0x38));
  *(float *)((in_RSI->module).pattern_table + 0x60) = (fVar1 * -2.0 * (float)(in_DL & 0xf)) / 15.0;
  xm_update_frequency(in_RSI,(xm_channel_context_t *)CONCAT17(in_DL,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

static void xm_vibrato(xm_context_t* ctx, xm_channel_context_t* ch, uint8_t param) {
	ch->vibrato_ticks += (param >> 4);
	ch->vibrato_note_offset =
		-2.f
		* xm_waveform(ch->vibrato_waveform, ch->vibrato_ticks)
		* (float)(param & 0x0F) / (float)0xF;
	xm_update_frequency(ctx, ch);
}